

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zetMetricGroupGetGlobalTimestampsExp
          (zet_metric_group_handle_t hMetricGroup,ze_bool_t synchronizedWithHost,
          uint64_t *globalTimestamp,uint64_t *metricTimestamp)

{
  ze_result_t zVar1;
  
  if (DAT_0010e848 != (code *)0x0) {
    zVar1 = (*DAT_0010e848)(hMetricGroup,synchronizedWithHost);
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGroupGetGlobalTimestampsExp(
        zet_metric_group_handle_t hMetricGroup,         ///< [in] handle of the metric group
        ze_bool_t synchronizedWithHost,                 ///< [in] Returns the timestamps synchronized to the host or the device.
        uint64_t* globalTimestamp,                      ///< [out] Device timestamp.
        uint64_t* metricTimestamp                       ///< [out] Metric timestamp.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetGlobalTimestampsExp = context.zetDdiTable.MetricGroupExp.pfnGetGlobalTimestampsExp;
        if( nullptr != pfnGetGlobalTimestampsExp )
        {
            result = pfnGetGlobalTimestampsExp( hMetricGroup, synchronizedWithHost, globalTimestamp, metricTimestamp );
        }
        else
        {
            // generic implementation
        }

        return result;
    }